

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-server.c
# Opt level: O1

int lws_callback_http(lws *wsi,lws_callback_reasons reason,void *user,void *in,size_t len)

{
  int iVar1;
  int iVar2;
  uchar *puVar3;
  lws_token_indexes token;
  ulong uVar4;
  char buf [1024];
  char acStack_438 [1023];
  undefined1 local_39;
  
  if (reason == LWS_CALLBACK_HTTP) {
    token = WSI_TOKEN_GET_URI;
    do {
      puVar3 = lws_token_to_string(token);
      if (puVar3 != (uchar *)0x0) {
        iVar1 = lws_hdr_total_length(wsi,token);
        if (iVar1 < 0x400 && iVar1 != 0) {
          iVar1 = lws_hdr_copy(wsi,acStack_438,0x400,token);
          if (iVar1 < 0) {
            fprintf(_stderr,"    %s (too big)\n",puVar3);
          }
          else {
            local_39 = 0;
            fprintf(_stderr,"    %s = %s\n",puVar3,acStack_438);
          }
        }
      }
      token = token + WSI_TOKEN_POST_URI;
    } while (puVar3 != (uchar *)0x0);
    iVar1 = lws_hdr_copy_fragment(wsi,acStack_438,0x400,WSI_TOKEN_HTTP_URI_ARGS,0);
    if (0 < iVar1) {
      uVar4 = 1;
      do {
        _lws_log(4,"URI Arg %d: %s\n",uVar4,acStack_438);
        iVar1 = lws_hdr_copy_fragment(wsi,acStack_438,0x400,WSI_TOKEN_HTTP_URI_ARGS,(int)uVar4);
        uVar4 = (ulong)((int)uVar4 + 1);
      } while (0 < iVar1);
    }
    iVar2 = lws_return_http_status(wsi,0x194,(char *)0x0);
    iVar1 = -1;
    if (iVar2 == 0) {
      iVar1 = lws_http_transaction_completed(wsi);
      iVar1 = -(uint)(iVar1 != 0);
    }
    return iVar1;
  }
  iVar1 = lws_callback_http_dummy(wsi,reason,user,in,len);
  return iVar1;
}

Assistant:

static int
lws_callback_http(struct lws *wsi, enum lws_callback_reasons reason, void *user,
		  void *in, size_t len)
{
	const unsigned char *c;
	char buf[1024];
	int n = 0, hlen;

	switch (reason) {
	case LWS_CALLBACK_HTTP:

		/* non-mount-handled accesses will turn up here */

		/* dump the headers */

		do {
			c = lws_token_to_string(n);
			if (!c) {
				n++;
				continue;
			}

			hlen = lws_hdr_total_length(wsi, n);
			if (!hlen || hlen > (int)sizeof(buf) - 1) {
				n++;
				continue;
			}

			if (lws_hdr_copy(wsi, buf, sizeof buf, n) < 0)
				fprintf(stderr, "    %s (too big)\n", (char *)c);
			else {
				buf[sizeof(buf) - 1] = '\0';

				fprintf(stderr, "    %s = %s\n", (char *)c, buf);
			}
			n++;
		} while (c);

		/* dump the individual URI Arg parameters */

		n = 0;
		while (lws_hdr_copy_fragment(wsi, buf, sizeof(buf),
					     WSI_TOKEN_HTTP_URI_ARGS, n) > 0) {
			lwsl_notice("URI Arg %d: %s\n", ++n, buf);
		}

		if (lws_return_http_status(wsi, HTTP_STATUS_NOT_FOUND, NULL))
			return -1;

		if (lws_http_transaction_completed(wsi))
			return -1;

		return 0;
	default:
		break;
	}

	return lws_callback_http_dummy(wsi, reason, user, in, len);
}